

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O0

char __thiscall Imaginer::Utils::iRpn::getFun(iRpn *this,string *funname)

{
  char cVar1;
  bool local_29;
  char local_19;
  char index;
  string *funname_local;
  iRpn *this_local;
  
  local_19 = -1;
  cVar1 = local_19;
  do {
    local_19 = cVar1;
    cVar1 = local_19 + '\x01';
    local_29 = false;
    if (cVar1 < '\x14') {
      local_29 = std::operator!=(funname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(_sysfunS_abi_cxx11_ + (long)cVar1 * 0x20));
    }
  } while (local_29 != false);
  return local_19 + -0x7f;
}

Assistant:

char   iRpn::getFun(std::string funname)
{
    char index = -1;
    while(++index < FUNNUM && funname != _sysfunS[index]);
    //    std::cout << _sysfunS[index] << std::endl;
    return (index - 128);
}